

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O3

cbtScalar EdgeSeparation(cbtBox2dShape *poly1,cbtTransform *xf1,int edge1,cbtBox2dShape *poly2,
                        cbtTransform *xf2)

{
  float fVar1;
  float fVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  undefined1 auVar7 [16];
  cbtScalar *pcVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  uVar9 = (ulong)edge1;
  fVar1 = (xf1->m_basis).m_el[0].m_floats[1];
  pcVar8 = poly2->m_vertices[0].m_floats + 2;
  uVar11 = 0xffffffff;
  uVar12 = 0;
  bVar13 = (long)(uVar9 << 3) < 0;
  bVar14 = (uVar9 & 0xfffffffffffffff) == 0;
  fVar2 = poly1->m_normals[uVar9].m_floats[1];
  cVar3 = poly1->m_normals[uVar9].m_floats[0];
  cVar4 = poly1->m_normals[uVar9].m_floats[2];
  auVar36 = ZEXT416((uint)(xf1->m_basis).m_el[1].m_floats[1]);
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar36);
  auVar38 = ZEXT416((uint)(xf1->m_basis).m_el[2].m_floats[1]);
  auVar16 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar38);
  auVar32 = ZEXT416((uint)(xf1->m_basis).m_el[1].m_floats[0]);
  auVar15 = vfmadd231ss_fma(auVar15,auVar32,ZEXT416((uint)cVar3));
  auVar23 = ZEXT416((uint)(xf1->m_basis).m_el[0].m_floats[0]);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),auVar23,ZEXT416((uint)cVar3));
  auVar34 = ZEXT416((uint)(xf1->m_basis).m_el[2].m_floats[0]);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar34,ZEXT416((uint)cVar3));
  auVar25 = ZEXT416((uint)(xf1->m_basis).m_el[1].m_floats[2]);
  auVar15 = vfmadd231ss_fma(auVar15,auVar25,ZEXT416((uint)cVar4));
  auVar22 = ZEXT416((uint)(xf1->m_basis).m_el[0].m_floats[2]);
  auVar7 = vfmadd231ss_fma(auVar7,auVar22,ZEXT416((uint)cVar4));
  auVar37 = ZEXT416((uint)(xf1->m_basis).m_el[2].m_floats[2]);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar37,ZEXT416((uint)cVar4));
  auVar30 = ZEXT416((uint)(xf2->m_basis).m_el[1].m_floats[0]);
  auVar17 = vmulss_avx512f(auVar15,auVar30);
  auVar33 = ZEXT416((uint)(xf2->m_basis).m_el[1].m_floats[1]);
  auVar18 = vmulss_avx512f(auVar15,auVar33);
  auVar28 = ZEXT416((uint)(xf2->m_basis).m_el[1].m_floats[2]);
  auVar19 = vmulss_avx512f(auVar15,auVar28);
  auVar31 = ZEXT416((uint)(xf2->m_basis).m_el[0].m_floats[0]);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar31,auVar7);
  auVar35 = ZEXT416((uint)(xf2->m_basis).m_el[0].m_floats[1]);
  auVar18 = vfmadd231ss_avx512f(auVar18,auVar35,auVar7);
  auVar29 = ZEXT416((uint)(xf2->m_basis).m_el[0].m_floats[2]);
  auVar19 = vfmadd231ss_avx512f(auVar19,auVar29,auVar7);
  auVar26 = ZEXT416((uint)(xf2->m_basis).m_el[2].m_floats[0]);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar26,auVar16);
  auVar24 = ZEXT416((uint)(xf2->m_basis).m_el[2].m_floats[1]);
  auVar18 = vfmadd231ss_avx512f(auVar18,auVar24,auVar16);
  auVar27 = ZEXT416((uint)(xf2->m_basis).m_el[2].m_floats[2]);
  auVar19 = vfmadd231ss_avx512f(auVar19,auVar27,auVar16);
  do {
    auVar20 = vmulss_avx512f(auVar18,ZEXT416((uint)pcVar8[-1]));
    auVar20 = vfmadd231ss_avx512f(auVar20,auVar17,
                                  ZEXT416((uint)((cbtVector3 *)(pcVar8 + -2))->m_floats[0]));
    auVar21 = vfmadd231ss_avx512f(auVar20,auVar19,ZEXT416((uint)*pcVar8));
    auVar20 = vucomiss_avx512f(auVar21);
    vminss_avx512f(auVar21,auVar20);
    if (!bVar13 && !bVar14) {
      uVar11 = uVar12 & 0xffffffff;
    }
    uVar12 = uVar12 + 1;
    pcVar8 = pcVar8 + 4;
    bVar13 = uVar12 < 4;
    bVar14 = uVar12 == 4;
  } while (!bVar14);
  cVar3 = poly1->m_vertices[uVar9].m_floats[1];
  cVar4 = poly1->m_vertices[uVar9].m_floats[0];
  iVar10 = (int)uVar11;
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar3));
  auVar17 = vfmadd213ss_avx512f(auVar23,ZEXT416((uint)cVar4),auVar17);
  cVar5 = poly1->m_vertices[uVar9].m_floats[2];
  auVar17 = vfmadd213ss_fma(auVar22,ZEXT416((uint)cVar5),auVar17);
  auVar18 = vmulss_avx512f(auVar36,ZEXT416((uint)cVar3));
  cVar6 = poly2->m_vertices[iVar10].m_floats[1];
  auVar18 = vfmadd213ss_avx512f(auVar32,ZEXT416((uint)cVar4),auVar18);
  auVar19 = vmulss_avx512f(auVar38,ZEXT416((uint)cVar3));
  auVar19 = vfmadd213ss_avx512f(auVar34,ZEXT416((uint)cVar4),auVar19);
  auVar18 = vfmadd213ss_fma(auVar25,ZEXT416((uint)cVar5),auVar18);
  auVar22 = vmulss_avx512f(auVar24,ZEXT416((uint)cVar6));
  auVar23 = vmulss_avx512f(auVar33,ZEXT416((uint)cVar6));
  auVar19 = vfmadd213ss_avx512f(auVar37,ZEXT416((uint)cVar5),auVar19);
  cVar3 = poly2->m_vertices[iVar10].m_floats[0];
  auVar24 = vmulss_avx512f(auVar35,ZEXT416((uint)cVar6));
  cVar4 = poly2->m_vertices[iVar10].m_floats[2];
  auVar25 = vaddss_avx512f(auVar19,ZEXT416((uint)(xf1->m_origin).m_floats[2]));
  auVar24 = vfmadd213ss_avx512f(auVar31,ZEXT416((uint)cVar3),auVar24);
  auVar19 = vfmadd213ss_fma(auVar26,ZEXT416((uint)cVar3),auVar22);
  auVar22 = vfmadd213ss_fma(auVar30,ZEXT416((uint)cVar3),auVar23);
  auVar19 = vfmadd213ss_avx512f(auVar27,ZEXT416((uint)cVar4),auVar19);
  auVar26 = vfmadd213ss_avx512f(auVar29,ZEXT416((uint)cVar4),auVar24);
  auVar22 = vfmadd213ss_avx512f(auVar28,ZEXT416((uint)cVar4),auVar22);
  auVar15 = vfmadd213ss_fma(auVar7,ZEXT416((uint)((auVar26._0_4_ + (xf2->m_origin).m_floats[0]) -
                                                 (auVar17._0_4_ + (xf1->m_origin).m_floats[0]))),
                            ZEXT416((uint)(auVar15._0_4_ *
                                          ((auVar22._0_4_ + (xf2->m_origin).m_floats[1]) -
                                          (auVar18._0_4_ + (xf1->m_origin).m_floats[1])))));
  auVar15 = vfmadd213ss_fma(auVar16,ZEXT416((uint)((auVar19._0_4_ + (xf2->m_origin).m_floats[2]) -
                                                  auVar25._0_4_)),auVar15);
  return auVar15._0_4_;
}

Assistant:

static cbtScalar EdgeSeparation(const cbtBox2dShape* poly1, const cbtTransform& xf1, int edge1,
							   const cbtBox2dShape* poly2, const cbtTransform& xf2)
{
	const cbtVector3* vertices1 = poly1->getVertices();
	const cbtVector3* normals1 = poly1->getNormals();

	int count2 = poly2->getVertexCount();
	const cbtVector3* vertices2 = poly2->getVertices();

	cbtAssert(0 <= edge1 && edge1 < poly1->getVertexCount());

	// Convert normal from poly1's frame into poly2's frame.
	cbtVector3 normal1World = b2Mul(xf1.getBasis(), normals1[edge1]);
	cbtVector3 normal1 = b2MulT(xf2.getBasis(), normal1World);

	// Find support vertex on poly2 for -normal.
	int index = 0;
	cbtScalar minDot = BT_LARGE_FLOAT;

	if (count2 > 0)
		index = (int)normal1.minDot(vertices2, count2, minDot);

	cbtVector3 v1 = b2Mul(xf1, vertices1[edge1]);
	cbtVector3 v2 = b2Mul(xf2, vertices2[index]);
	cbtScalar separation = b2Dot(v2 - v1, normal1World);
	return separation;
}